

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86LEA(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  uint uVar2;
  byte bVar3;
  
  bVar3 = 8 < (int)base | (8 < (int)index) * '\x02' | (8 < (int)dst) << 2 | (size == sQWORD) << 3;
  if (bVar3 != 0) {
    *stream = bVar3 | 0x40;
  }
  puVar1 = stream + (bVar3 != 0);
  *puVar1 = 0x8d;
  uVar2 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,(int)regCode[dst]);
  return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86LEA(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, size == sQWORD, dst, index, base);
	*stream++ = 0x8d;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}